

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O0

bool __thiscall ON_ModelComponent::SetIndex(ON_ModelComponent *this,int component_index)

{
  int iVar1;
  bool bContentChange;
  uint bit;
  int component_index_local;
  ON_ModelComponent *this_local;
  
  if ((this->m_locked_status & 0x10) == 0) {
    iVar1 = this->m_component_index;
    this->m_component_index = component_index;
    this->m_set_status = this->m_set_status | 0x10;
    if (iVar1 != component_index) {
      IncrementContentVersionNumber(this);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_ModelComponent::SetIndex(
  int component_index
  )
{
  const unsigned int bit = ON_ModelComponent::Attributes::IndexAttribute;
  if (0 != (bit & m_locked_status))
    return false;

  const bool bContentChange = (m_component_index !=  component_index);

  m_component_index = component_index;
  m_set_status |= bit;

  if ( bContentChange )
    IncrementContentVersionNumber();

  return true;
}